

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Tree::set_val_anchor(Tree *this,size_t node,csubstr anchor)

{
  NodeData *pNVar1;
  code *pcVar2;
  bool bVar3;
  NodeType_e f;
  basic_substring<const_char> bVar4;
  basic_substring<const_char> local_38;
  
  local_38.len = anchor.len;
  local_38.str = anchor.str;
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    (*(code *)PTR_error_impl_0023c518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((this->m_buf[node].m_type.type & VALREF) != NOTYPE) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    (*(code *)PTR_error_impl_0023c518)
              ("check failed: ! is_val_ref(node)",0x20,(anonymous_namespace)::s_default_callbacks);
  }
  bVar4 = basic_substring<const_char>::triml(&local_38,'&');
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    (*(code *)PTR_error_impl_0023c518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  pNVar1 = this->m_buf;
  pNVar1[node].m_val.anchor.str = bVar4.str;
  pNVar1[node].m_val.anchor.len = bVar4.len;
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    (*(code *)PTR_error_impl_0023c518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  pNVar1 = this->m_buf;
  f = pNVar1[node].m_type.type | VALANCH;
  _check_next_flags(this,node,f);
  pNVar1[node].m_type.type = f;
  return;
}

Assistant:

void set_val_anchor(size_t node, csubstr anchor) { RYML_ASSERT( ! is_val_ref(node)); _p(node)->m_val.anchor = anchor.triml('&'); _add_flags(node, VALANCH); }